

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void queue_master_msg(EVmaster master,void *vmsg,EVmaster_msg_type msg_type,CMConnection conn,
                     int copy)

{
  int iVar1;
  _EVmaster_msg *p_Var2;
  CManager_conflict cm;
  char *pcVar3;
  _EVmaster_msg *p_Var4;
  EVattr_stone_struct *pEVar5;
  char *pcVar6;
  leaf_element *plVar7;
  EVmaster_msg_ptr *pp_Var8;
  EVmaster_msg_ptr p_Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  EVdeploy_ack_ptr in;
  
  p_Var4 = (_EVmaster_msg *)INT_CMmalloc(0x40);
  p_Var4->msg_type = msg_type;
  p_Var4->conn = conn;
  switch(msg_type) {
  case DFGnode_join:
    if (copy == 0) {
      (p_Var4->u).node_join.sources = *(leaf_element **)((long)vmsg + 0x20);
      pcVar6 = *vmsg;
      pcVar3 = *(char **)((long)vmsg + 8);
      plVar7 = *(leaf_element **)((long)vmsg + 0x18);
      (p_Var4->u).flush_reconfig.attr_stone_list = *(EVattr_stone_struct **)((long)vmsg + 0x10);
      (p_Var4->u).node_join.sinks = plVar7;
      (p_Var4->u).node_join.node_name = pcVar6;
      (p_Var4->u).node_join.contact_string = pcVar3;
    }
    else {
      pcVar6 = strdup(*vmsg);
      (p_Var4->u).node_join.node_name = pcVar6;
      pcVar6 = strdup(*(char **)((long)vmsg + 8));
      (p_Var4->u).node_join.contact_string = pcVar6;
      (p_Var4->u).node_join.source_count = *(int *)((long)vmsg + 0x10);
      iVar1 = *(int *)((long)vmsg + 0x14);
      (p_Var4->u).node_join.sink_count = iVar1;
      plVar7 = (leaf_element *)INT_CMmalloc((long)iVar1 << 4);
      (p_Var4->u).node_join.sinks = plVar7;
      iVar1 = *(int *)((long)vmsg + 0x14);
      if (0 < (long)iVar1) {
        lVar11 = *(long *)((long)vmsg + 0x18);
        lVar10 = 0;
        do {
          pcVar6 = *(char **)(lVar11 + lVar10);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = strdup(pcVar6);
          }
          *(char **)((long)&((p_Var4->u).node_join.sinks)->name + lVar10) = pcVar6;
          pcVar6 = *(char **)(lVar11 + 8 + lVar10);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = strdup(pcVar6);
          }
          *(char **)((long)&((p_Var4->u).node_join.sinks)->FMtype + lVar10) = pcVar6;
          lVar10 = lVar10 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar10);
      }
      plVar7 = (leaf_element *)INT_CMmalloc((long)*(int *)((long)vmsg + 0x10) << 4);
      (p_Var4->u).node_join.sources = plVar7;
      iVar1 = *(int *)((long)vmsg + 0x10);
      if (0 < (long)iVar1) {
        lVar11 = *(long *)((long)vmsg + 0x20);
        lVar10 = 0;
        do {
          pcVar6 = *(char **)(lVar11 + lVar10);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = strdup(pcVar6);
          }
          *(char **)((long)&((p_Var4->u).node_join.sources)->name + lVar10) = pcVar6;
          pcVar6 = *(char **)(lVar11 + 8 + lVar10);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar6 = strdup(pcVar6);
          }
          *(char **)((long)&((p_Var4->u).node_join.sources)->FMtype + lVar10) = pcVar6;
          lVar10 = lVar10 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar10);
      }
    }
    break;
  case DFGdeploy_ack:
    (p_Var4->u).node_join.node_name = *vmsg;
    break;
  case DFGshutdown_contrib:
  case DFGconn_shutdown:
    (p_Var4->u).shutdown_contrib.value = *vmsg;
    break;
  case DFGflush_reconfig:
    (p_Var4->u).flush_reconfig.attr_stone_list = *(EVattr_stone_struct **)((long)vmsg + 0x10);
    pcVar6 = *(char **)((long)vmsg + 8);
    (p_Var4->u).node_join.node_name = *vmsg;
    (p_Var4->u).node_join.contact_string = pcVar6;
    if (copy != 0) {
      pEVar5 = (EVattr_stone_struct *)INT_CMmalloc(*(long *)((long)vmsg + 8) << 4);
      (p_Var4->u).flush_reconfig.attr_stone_list = pEVar5;
      lVar11 = *(long *)((long)vmsg + 8);
      if (0 < lVar11) {
        lVar10 = *(long *)((long)vmsg + 0x10);
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&((p_Var4->u).flush_reconfig.attr_stone_list)->stone + lVar12) =
               *(undefined8 *)(lVar10 + lVar12);
          pcVar6 = strdup(*(char **)(lVar10 + 8 + lVar12));
          *(char **)((long)&((p_Var4->u).flush_reconfig.attr_stone_list)->attr_str + lVar12) =
               pcVar6;
          lVar12 = lVar12 + 0x10;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
    }
    break;
  default:
    printf("MEssage type bad, value is %d  %d\n",(ulong)msg_type,(ulong)msg_type);
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                  ,0x995,
                  "void queue_master_msg(EVmaster, void *, EVmaster_msg_type, CMConnection, int)");
  }
  p_Var4->next = (_EVmaster_msg *)0x0;
  p_Var2 = master->queued_messages;
  if (master->queued_messages == (EVmaster_msg_ptr)0x0) {
    pp_Var8 = &master->queued_messages;
  }
  else {
    do {
      p_Var9 = p_Var2;
      p_Var2 = p_Var9->next;
    } while (p_Var2 != (_EVmaster_msg *)0x0);
    pp_Var8 = &p_Var9->next;
  }
  *pp_Var8 = p_Var4;
  cm = master->cm;
  if (cm->control_list->server_thread == 0) {
    handle_queued_messages(cm,master);
    return;
  }
  CMwake_server_thread(cm);
  return;
}

Assistant:

static void
queue_master_msg(EVmaster master, void*vmsg, EVmaster_msg_type msg_type, CMConnection conn, int copy)
{
    EVmaster_msg_ptr msg = malloc(sizeof(EVmaster_msg));
    msg->msg_type = msg_type;
    msg->conn = conn;
    switch(msg_type) {
    case DFGnode_join: {
	EVnode_join_ptr in = (EVnode_join_ptr)vmsg;
	if (!copy) {
	    msg->u.node_join = *in;
	} else {
	    int i;
	    msg->u.node_join.node_name = strdup(in->node_name);
	    msg->u.node_join.contact_string = strdup(in->contact_string);
	    msg->u.node_join.source_count = in->source_count;
	    msg->u.node_join.sink_count = in->sink_count;
	    msg->u.node_join.sinks = (leaf_element*)malloc(sizeof(leaf_element) * in->sink_count);
	    for (i=0; i < in->sink_count; i++) {
		leaf_element *l = &in->sinks[i];
		msg->u.node_join.sinks[i].name = l->name ? strdup(l->name) : NULL;
		msg->u.node_join.sinks[i].FMtype = l->FMtype ? strdup(l->FMtype) : NULL;
	    }
	    msg->u.node_join.sources = (leaf_element*)malloc(sizeof(leaf_element) * in->source_count);
	    for (i=0; i < in->source_count; i++) {
		leaf_element *l = &in->sources[i];
		msg->u.node_join.sources[i].name = l->name ? strdup(l->name) : NULL;
		msg->u.node_join.sources[i].FMtype = l->FMtype ? strdup(l->FMtype) : NULL;
	    }
	}
	break;
    }
    case DFGdeploy_ack: {
	EVdeploy_ack_ptr in = (EVdeploy_ack_ptr)vmsg;
	msg->u.deploy_ack = *in;
	break;
    }
    case DFGshutdown_contrib: {
	EVshutdown_contribution_ptr in = (EVshutdown_contribution_ptr)vmsg;
	msg->u.shutdown_contrib = *in;
	break;
    }
    case  DFGconn_shutdown: {
	EVconn_shutdown_ptr in = (EVconn_shutdown_ptr)vmsg;
	msg->u.conn_shutdown = *in;
	break;
    }
    case DFGflush_reconfig: {
	EVflush_attrs_reconfig_ptr in = (EVflush_attrs_reconfig_ptr)vmsg;
	msg->u.flush_reconfig = *in;
	if (copy) {
	    int i;
	    msg->u.flush_reconfig.attr_stone_list = malloc(sizeof(EVattr_stone_struct) * in->count);
	    for (i=0 ; i < in->count; i++) {
		msg->u.flush_reconfig.attr_stone_list[i].stone = in->attr_stone_list[i].stone;
		msg->u.flush_reconfig.attr_stone_list[i].attr_str = strdup(in->attr_stone_list[i].attr_str);
	    }
	}
	break;
    }
    default:
	printf("MEssage type bad, value is %d  %d\n", msg_type, msg->msg_type);
	assert(FALSE);
    }
    msg->next = NULL;
    if (master->queued_messages == NULL) {
	master->queued_messages = msg;
    } else {
	EVmaster_msg_ptr last = master->queued_messages;
	while (last->next != NULL) last = last->next;
	last->next = msg;
    }
    if (master->cm->control_list->server_thread != 0) {
	CMwake_server_thread(master->cm);
    } else {
	handle_queued_messages(master->cm, master);
    }
}